

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

void __thiscall wabt::BinaryReaderLogging::LogType(BinaryReaderLogging *this,Type type)

{
  Stream *this_00;
  bool bVar1;
  char *pcVar2;
  Type type_local;
  BinaryReaderLogging *this_local;
  
  bVar1 = IsTypeIndex(type);
  if (bVar1) {
    Stream::Writef(this->stream_,"funcidx[%d]",(ulong)(uint)type);
  }
  else {
    this_00 = this->stream_;
    pcVar2 = GetTypeName(type);
    Stream::Writef(this_00,"%s",pcVar2);
  }
  return;
}

Assistant:

void BinaryReaderLogging::LogType(Type type) {
  if (IsTypeIndex(type)) {
    LOGF_NOINDENT("funcidx[%d]", static_cast<int>(type));
  } else {
    LOGF_NOINDENT("%s", GetTypeName(type));
  }
}